

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

void deqp::gles3::Functional::FboTestUtil::clearColorBuffer
               (Context *ctx,TextureFormat *format,Vec4 *value)

{
  int i;
  TextureChannelClass TVar1;
  long lVar2;
  Vector<unsigned_int,_4> res;
  int local_28 [6];
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    (*ctx->_vptr_Context[0x2f])(ctx,0x1800,0,value);
    return;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    local_28[0] = 0;
    local_28[1] = 0;
    local_28[2] = 0;
    local_28[3] = 0;
    lVar2 = 0;
    do {
      local_28[lVar2] = (int)value->m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    (*ctx->_vptr_Context[0x2e])(ctx,0x1800,0,local_28);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    local_28[0] = 0;
    local_28[1] = 0;
    local_28[2] = 0;
    local_28[3] = 0;
    lVar2 = 0;
    do {
      local_28[lVar2] = (int)(long)value->m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    (*ctx->_vptr_Context[0x30])(ctx,0x1800,0,local_28);
  }
  return;
}

Assistant:

void clearColorBuffer (sglr::Context& ctx, const tcu::TextureFormat& format, const tcu::Vec4& value)
{
	const tcu::TextureChannelClass fmtClass = tcu::getTextureChannelClass(format.type);

	switch (fmtClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			ctx.clearBufferfv(GL_COLOR, 0, value.getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			ctx.clearBufferuiv(GL_COLOR, 0, value.asUint().getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			ctx.clearBufferiv(GL_COLOR, 0, value.asInt().getPtr());
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}